

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satStore.c
# Opt level: O0

int Sto_ManLoadNumber(FILE *pFile,int *pNumber)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  int local_34;
  int local_28;
  int Sign;
  int Number;
  int Char;
  int *pNumber_local;
  FILE *pFile_local;
  
  local_28 = 0;
  bVar1 = false;
  do {
    iVar2 = fgetc((FILE *)pFile);
    if (iVar2 == -1) {
      return 0;
    }
    bVar4 = true;
    if (((iVar2 != 0x20) && (bVar4 = true, iVar2 != 9)) && (bVar4 = true, iVar2 != 0xd)) {
      bVar4 = iVar2 == 10;
    }
  } while (bVar4);
  while( true ) {
    uVar3 = fgetc((FILE *)pFile);
    if (((uVar3 == 0x20) || (uVar3 == 9)) || ((uVar3 == 0xd || (uVar3 == 10)))) {
      if (bVar1) {
        local_34 = -local_28;
      }
      else {
        local_34 = local_28;
      }
      *pNumber = local_34;
      return 1;
    }
    if ((((int)uVar3 < 0x30) || (0x39 < (int)uVar3)) && (uVar3 != 0x2d)) break;
    if (uVar3 == 0x2d) {
      bVar1 = true;
    }
    else {
      local_28 = local_28 * 10 + uVar3;
    }
  }
  printf("Error: Wrong char (%c) in the input file.\n",(ulong)uVar3);
  return 0;
}

Assistant:

int Sto_ManLoadNumber( FILE * pFile, int * pNumber )
{
    int Char, Number = 0, Sign = 0;
    // skip space-like chars
    do {
        Char = fgetc( pFile );
        if ( Char == EOF )
            return 0;
    } while ( Char == ' ' || Char == '\t' || Char == '\r' || Char == '\n' );
    // read the literal
    while ( 1 )
    {
        // get the next character
        Char = fgetc( pFile );
        if ( Char == ' ' || Char == '\t' || Char == '\r' || Char == '\n' )
            break;
        // check that the char is a digit
        if ( (Char < '0' || Char > '9') && Char != '-' )
        {
            printf( "Error: Wrong char (%c) in the input file.\n", Char );
            return 0;
        }
        // check if this is a minus
        if ( Char == '-' )
            Sign = 1;
        else
            Number = 10 * Number + Char;
    }
    // return the number
    *pNumber = Sign? -Number : Number;
    return 1;
}